

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O3

void anon_unknown.dwarf_32fbc0::writeCopyRead(string *tempDir,int w,int h,int xs,int ys)

{
  Array2D<Imath_3_2::half> *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  pointer piVar10;
  undefined1 *puVar11;
  Rand32 RVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  char cVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ostream *poVar24;
  long *plVar25;
  uint *puVar26;
  undefined4 *puVar27;
  char *pcVar28;
  half *phVar29;
  int *piVar30;
  void *pvVar31;
  undefined8 *puVar32;
  undefined8 *puVar33;
  float *pfVar34;
  float *pfVar35;
  ChannelList *pCVar36;
  ChannelList *pCVar37;
  ulong uVar38;
  ulong *puVar39;
  long lVar40;
  ulong *puVar41;
  uint uVar42;
  undefined4 uVar43;
  undefined8 uVar44;
  ulong *puVar45;
  half *phVar46;
  int tileY;
  int iVar47;
  ulong *__s;
  undefined4 in_register_00000034;
  void *pvVar48;
  ulong uVar49;
  ulong uVar50;
  int tileX_1;
  Array2D<Imath_3_2::half> *pAVar51;
  ulong *__s_00;
  int tileX_5;
  byte bVar52;
  int tileY_1;
  long lVar53;
  long lVar54;
  int tileX;
  long lVar55;
  long lVar56;
  ulong __n;
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar71;
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  long local_210;
  vector<int,_std::allocator<int>_> tileYs;
  _Base_ptr local_1f0;
  _Base_ptr local_1e8;
  int local_1d8;
  uint local_1d4;
  allocator_type local_1cd;
  uint local_1cc;
  FrameBuffer fb;
  Rand32 rand1_1;
  vector<int,_std::allocator<int>_> tileXs;
  Array2D<Imath_3_2::half> ph1;
  TiledOutputFile out;
  long local_138;
  ulong local_108;
  Rand32 rand1;
  Array2D<Imath_3_2::half> *pAStack_f0;
  pointer local_e8;
  string filename;
  Header hdr;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,tempDir,
             (long)&(tempDir->_M_dataplus)._M_p + CONCAT44(in_register_00000034,w));
  std::__cxx11::string::append((char *)&filename);
  uVar42 = 0;
  do {
    if ((uVar42 & 0xe) != 6) {
      bVar5 = false;
      local_1d4 = 0;
      bVar14 = true;
      do {
        bVar9 = bVar14;
        local_1d8 = 0;
        bVar14 = true;
        do {
          bVar8 = bVar14;
          uVar19 = 0;
          bVar14 = true;
          do {
            bVar7 = bVar14;
            local_1cc = uVar19;
            bVar52 = 0;
            bVar14 = true;
            do {
              bVar6 = bVar14;
              _Var13._M_p = filename._M_dataplus._M_p;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"LineOrder ",10);
              poVar24 = (ostream *)std::ostream::operator<<(&std::cout,local_1d4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", buffer ",9);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", seek ",7);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", levelMode 0, ",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,"roundingMode ",0xd);
              poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", compression ",0xe);
              plVar25 = (long *)std::ostream::operator<<(poVar24,uVar42);
              std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
              std::ostream::put((char)plVar25);
              std::ostream::flush();
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              Imf_3_4::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&tileYs,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar26 = (uint *)Imf_3_4::Header::compression();
              *puVar26 = uVar42;
              puVar27 = (undefined4 *)Imf_3_4::Header::lineOrder();
              *puVar27 = 0;
              pcVar28 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar28,(Channel *)0x1c529f);
              _out = &DAT_3700000037;
              Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
              ph1._sizeX = 0x103;
              ph1._sizeY = 0xab;
              phVar29 = (half *)operator_new__(0x15a02);
              ph1._data = phVar29;
              fillPixels(&ph1,0xab,0x103);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_4::Slice::Slice((Slice *)&out,HALF,(char *)phVar29,2,0x156,1,1,0.0,false,false);
              Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8)
              ;
              std::ostream::flush();
              remove(_Var13._M_p);
              iVar16 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledOutputFile::TiledOutputFile(&out,_Var13._M_p,&hdr,iVar16);
              Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
              rand1._state = 0x5a5a5a5a;
              iVar16 = Imf_3_4::TiledOutputFile::numYTiles((int)&out);
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileYs,(long)iVar16,(allocator_type *)&tileXs);
              iVar16 = Imf_3_4::TiledOutputFile::numXTiles((int)&out);
              uVar19 = local_1cc;
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar16,(allocator_type *)&rand1_1);
              iVar16 = -1;
              for (lVar55 = 0; iVar17 = Imf_3_4::TiledOutputFile::numYTiles((int)&out),
                  lVar55 < iVar17; lVar55 = lVar55 + 1) {
                if (bVar5) {
                  iVar17 = Imf_3_4::TiledOutputFile::numYTiles((int)&out);
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17 + iVar16] = (int)lVar55;
                }
                else {
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar55] = (int)lVar55;
                }
                iVar16 = iVar16 + -1;
              }
              for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXTiles((int)&out),
                  lVar55 < iVar16; lVar55 = lVar55 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar55] = (int)lVar55;
              }
              if ((uVar19 & 1) != 0) {
                for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numYTiles((int)&out),
                    piVar10 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar55 < iVar16; lVar55 = lVar55 + 1
                    ) {
                  iVar16 = Imf_3_4::TiledOutputFile::numYTiles((int)&out);
                  fVar57 = (float)Imath_3_2::Rand32::nextf();
                  iVar17 = (int)((float)(iVar16 + -1) * fVar57 + (1.0 - fVar57) * (float)(int)lVar55
                                + 0.5);
                  iVar16 = piVar10[lVar55];
                  piVar10[lVar55] =
                       tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = iVar16;
                }
                for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXTiles((int)&out),
                    piVar10 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar55 < iVar16; lVar55 = lVar55 + 1
                    ) {
                  iVar16 = Imf_3_4::TiledOutputFile::numXTiles((int)&out);
                  fVar57 = (float)Imath_3_2::Rand32::nextf();
                  iVar17 = (int)((float)(iVar16 + -1) * fVar57 + (1.0 - fVar57) * (float)(int)lVar55
                                + 0.5);
                  iVar16 = piVar10[lVar55];
                  piVar10[lVar55] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = iVar16;
                }
              }
              for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numYTiles((int)&out),
                  lVar55 < iVar16; lVar55 = lVar55 + 1) {
                for (lVar56 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXTiles((int)&out),
                    lVar56 < iVar16; lVar56 = lVar56 + 1) {
                  Imf_3_4::TiledOutputFile::writeTile
                            ((int)&out,
                             tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar56],
                             tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar55]);
                }
              }
              if (tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              Imf_3_4::TiledOutputFile::~TiledOutputFile(&out);
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&fb);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8)
              ;
              std::ostream::flush();
              iVar16 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&tileYs,_Var13._M_p,iVar16);
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::dataWindow();
              iVar16 = *piVar30;
              lVar56 = (long)piVar30[2] - (long)iVar16;
              uVar38 = lVar56 + 1;
              iVar17 = piVar30[1];
              iVar18 = piVar30[3] - iVar17;
              uVar19 = iVar18 + 1;
              lVar55 = (long)(int)uVar19 * uVar38;
              uVar49 = lVar55 * 2;
              if (lVar55 < 0) {
                uVar49 = 0xffffffffffffffff;
              }
              pvVar31 = operator_new__(uVar49);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              uVar44 = 2;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_4::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)((long)pvVar31 + (long)iVar16 * -2 + (long)-iVar17 * uVar38 * 2),2,
                         uVar38 * 2,1,1,0.0,false,false);
              Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
              Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileYs);
              uVar20 = (byte)~bVar52 & 1;
              iVar16 = (int)(TiledInputFile *)&tileYs;
              if (local_1d4 == uVar20) {
                iVar17 = Imf_3_4::TiledInputFile::numYTiles(iVar16);
                iVar17 = iVar17 + -1;
                iVar16 = -1;
                iVar71 = -1;
              }
              else {
                iVar17 = 0;
                iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar16);
                iVar71 = 1;
              }
              for (; uVar43 = (undefined4)uVar44, iVar17 != iVar16; iVar17 = iVar17 + iVar71) {
                for (iVar23 = 0; iVar47 = Imf_3_4::TiledInputFile::numXTiles((int)&tileYs),
                    iVar23 < iVar47; iVar23 = iVar23 + 1) {
                  uVar44 = 0;
                  Imf_3_4::TiledInputFile::readTile((int)&tileYs,iVar23,iVar17);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," comparing",10);
              std::ostream::flush();
              Imf_3_4::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_4::Header::displayWindow();
              puVar33 = (undefined8 *)Imf_3_4::Header::displayWindow();
              iVar16 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar17 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar72._4_4_ = iVar16;
              auVar72._0_4_ = iVar16;
              auVar72._8_4_ = iVar17;
              auVar72._12_4_ = iVar17;
              iVar16 = movmskpd(uVar43,auVar72);
              if ((iVar16 != 3) ||
                 (iVar17 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar71 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar58._4_4_ = iVar17,
                 auVar58._0_4_ = iVar17, auVar58._8_4_ = iVar71, auVar58._12_4_ = iVar71,
                 iVar17 = movmskpd((int)puVar33,auVar58), iVar17 != 3)) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb7,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_4::Header::dataWindow();
              puVar33 = (undefined8 *)Imf_3_4::Header::dataWindow();
              iVar17 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar71 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar59._4_4_ = iVar17;
              auVar59._0_4_ = iVar17;
              auVar59._8_4_ = iVar71;
              auVar59._12_4_ = iVar71;
              iVar16 = movmskpd(iVar16,auVar59);
              if ((iVar16 != 3) ||
                 (iVar16 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar17 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar60._4_4_ = iVar16,
                 auVar60._0_4_ = iVar16, auVar60._8_4_ = iVar17, auVar60._12_4_ = iVar17,
                 iVar16 = movmskpd((int)puVar33,auVar60), iVar16 != 3)) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb8,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
              fVar57 = *pfVar34;
              pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
              if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb9,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::screenWindowCenter();
              pfVar35 = (float *)Imf_3_4::Header::screenWindowCenter();
              if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
                  (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbb,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
              fVar57 = *pfVar34;
              pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
              if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbc,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::lineOrder();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_4::Header::lineOrder();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbd,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::compression();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_4::Header::compression();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbe,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pCVar36 = (ChannelList *)Imf_3_4::Header::channels();
              pCVar37 = (ChannelList *)Imf_3_4::Header::channels();
              cVar15 = Imf_3_4::ChannelList::operator==(pCVar36,pCVar37);
              if (cVar15 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbf,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              if (-1 < iVar18) {
                uVar49 = 0;
                phVar46 = phVar29;
                pvVar48 = pvVar31;
                do {
                  if (-1 < (int)lVar56) {
                    uVar50 = 0;
                    do {
                      fVar57 = *(float *)(_imath_half_to_float_table + (ulong)phVar46[uVar50]._h * 4
                                         );
                      pfVar34 = (float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)((long)pvVar48 + uVar50 * 2) * 4);
                      if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                        __assert_fail("ph1[y][x] == ph2[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                      ,0xc3,
                                      "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                     );
                      }
                      uVar50 = uVar50 + 1;
                    } while ((uVar38 & 0xffffffff) != uVar50);
                  }
                  uVar49 = uVar49 + 1;
                  pvVar48 = (void *)((long)pvVar48 + uVar38 * 2);
                  phVar46 = phVar46 + 0xab;
                } while (uVar49 != uVar19);
              }
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&fb);
              operator_delete__(pvVar31);
              if (local_1f0 != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0);
              }
              if (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
              }
              remove(_Var13._M_p);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
              std::ostream::put(-0x60);
              std::ostream::flush();
              operator_delete__(phVar29);
              Imf_3_4::Header::~Header(&hdr);
              _Var13 = filename._M_dataplus;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"LineOrder ",10);
              poVar24 = (ostream *)std::ostream::operator<<(&std::cout,local_1d4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", buffer ",9);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", seek ",7);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", levelMode 1, ",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,"roundingMode ",0xd);
              poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", compression ",0xe);
              plVar25 = (long *)std::ostream::operator<<(poVar24,uVar42);
              std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
              std::ostream::put((char)plVar25);
              std::ostream::flush();
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              Imf_3_4::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&tileYs,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar26 = (uint *)Imf_3_4::Header::compression();
              *puVar26 = uVar42;
              puVar27 = (undefined4 *)Imf_3_4::Header::lineOrder();
              *puVar27 = 0;
              pcVar28 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar28,(Channel *)0x1c529f);
              _out = &DAT_3700000037;
              Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
              rand1._state = 0;
              pAStack_f0 = (Array2D<Imath_3_2::half> *)0x0;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8)
              ;
              std::ostream::flush();
              remove(_Var13._M_p);
              iVar16 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&tileYs,_Var13._M_p,&hdr,iVar16);
              uVar19 = Imf_3_4::TiledOutputFile::numLevels();
              uVar50 = (ulong)uVar19;
              __n = (ulong)(int)uVar19;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = __n;
              uVar38 = SUB168(auVar2 * ZEXT816(0x18),0);
              uVar49 = uVar38 + 8;
              if (0xfffffffffffffff7 < uVar38) {
                uVar49 = 0xffffffffffffffff;
              }
              if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
                uVar49 = 0xffffffffffffffff;
              }
              puVar39 = (ulong *)operator_new__(uVar49);
              *puVar39 = __n;
              if (uVar19 != 0) {
                memset((Array2D<Imath_3_2::half> *)(puVar39 + 1),0,
                       ((uVar38 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              if (pAStack_f0 != (Array2D<Imath_3_2::half> *)0x0) {
                phVar29 = pAStack_f0[-1]._data;
                pAVar51 = pAStack_f0 + -1;
                if (phVar29 != (half *)0x0) {
                  lVar55 = (long)phVar29 * 0x18;
                  do {
                    pvVar31 = *(void **)((long)&pAVar51->_data + lVar55);
                    if (pvVar31 != (void *)0x0) {
                      operator_delete__(pvVar31);
                    }
                    lVar55 = lVar55 + -0x18;
                  } while (lVar55 != 0);
                }
                operator_delete__(&pAVar51->_data,(long)phVar29 * 0x18 + 8);
              }
              pAStack_f0 = (Array2D<Imath_3_2::half> *)(puVar39 + 1);
              rand1._state = __n;
              rand1_1._state = 0x5a5a5a5a;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&ph1,__n,(allocator_type *)&out);
              if (0 < (int)uVar19) {
                lVar55 = uVar50 - 1;
                auVar61._8_4_ = (int)lVar55;
                auVar61._0_8_ = lVar55;
                auVar61._12_4_ = (int)((ulong)lVar55 >> 0x20);
                auVar61 = auVar61 ^ _DAT_001b7b10;
                uVar38 = 0;
                auVar70 = _DAT_001b7b00;
                do {
                  auVar72 = auVar70 ^ _DAT_001b7b10;
                  auVar74._0_4_ = -(uint)(auVar61._0_4_ < auVar72._0_4_);
                  auVar74._4_4_ = -(uint)(auVar61._4_4_ < auVar72._4_4_);
                  auVar74._8_4_ = -(uint)(auVar61._8_4_ < auVar72._8_4_);
                  auVar74._12_4_ = -(uint)(auVar61._12_4_ < auVar72._12_4_);
                  iVar16 = -(uint)(auVar72._4_4_ == auVar61._4_4_);
                  iVar17 = -(uint)(auVar72._12_4_ == auVar61._12_4_);
                  auVar75._4_4_ = iVar16;
                  auVar75._0_4_ = iVar16;
                  auVar75._8_4_ = iVar17;
                  auVar75._12_4_ = iVar17;
                  auVar73._4_4_ = auVar74._4_4_;
                  auVar73._0_4_ = auVar74._4_4_;
                  auVar73._8_4_ = auVar74._12_4_;
                  auVar73._12_4_ = auVar74._12_4_;
                  auVar73 = auVar73 | auVar75 & auVar74;
                  if ((~auVar73._0_4_ & 1) != 0) {
                    *(int *)(ph1._sizeX + uVar38 * 4) = (int)uVar38;
                  }
                  if (((auVar73 ^ _DAT_001bbea0) & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                  {
                    *(int *)(ph1._sizeX + 4 + uVar38 * 4) = (int)uVar38 + 1;
                  }
                  uVar38 = uVar38 + 2;
                  lVar55 = auVar70._8_8_;
                  auVar70._0_8_ = auVar70._0_8_ + 2;
                  auVar70._8_8_ = lVar55 + 2;
                } while ((uVar19 + 1 & 0xfffffffe) != uVar38);
                if ((local_1cc & 1) != 0) {
                  uVar38 = 0;
                  do {
                    lVar55 = ph1._sizeX;
                    fVar57 = (float)Imath_3_2::Rand32::nextf();
                    lVar56 = (long)(int)(fVar57 * (float)(int)(uVar19 - 1) +
                                         (1.0 - fVar57) * (float)(int)uVar38 + 0.5);
                    uVar43 = *(undefined4 *)(lVar55 + uVar38 * 4);
                    *(undefined4 *)(lVar55 + uVar38 * 4) = *(undefined4 *)(ph1._sizeX + lVar56 * 4);
                    *(undefined4 *)(ph1._sizeX + lVar56 * 4) = uVar43;
                    uVar38 = uVar38 + 1;
                  } while (uVar50 != uVar38);
                }
                uVar38 = 0;
                do {
                  iVar16 = *(int *)(ph1._sizeX + uVar38 * 4);
                  iVar17 = Imf_3_4::TiledOutputFile::levelWidth((int)&tileYs);
                  iVar18 = Imf_3_4::TiledOutputFile::levelHeight((int)&tileYs);
                  pAVar51 = pAStack_f0;
                  lVar56 = (long)iVar17;
                  lVar55 = iVar18 * lVar56;
                  uVar49 = lVar55 * 2;
                  if (lVar55 < 0) {
                    uVar49 = 0xffffffffffffffff;
                  }
                  phVar29 = (half *)operator_new__(uVar49);
                  pAVar1 = pAVar51 + iVar16;
                  if (pAVar1->_data != (half *)0x0) {
                    operator_delete__(pAVar1->_data);
                    pAVar51 = pAStack_f0;
                  }
                  pAVar1->_sizeX = (long)iVar18;
                  pAVar1->_sizeY = lVar56;
                  pAVar1->_data = phVar29;
                  fillPixels(pAVar51 + iVar16,iVar17,iVar18);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_4::Slice::Slice
                            ((Slice *)&out,HALF,(char *)pAStack_f0[iVar16]._data,2,lVar56 * 2,1,1,
                             0.0,false,false);
                  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
                  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                  iVar17 = (int)(FrameBuffer *)&tileYs;
                  iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&out,(long)iVar16,
                             (allocator_type *)&tileXs);
                  iVar16 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
                  std::vector<int,_std::allocator<int>_>::vector(&tileXs,(long)iVar16,&local_1cd);
                  iVar16 = -1;
                  for (lVar55 = 0; iVar18 = Imf_3_4::TiledOutputFile::numYTiles(iVar17),
                      lVar55 < iVar18; lVar55 = lVar55 + 1) {
                    if (bVar5) {
                      iVar18 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
                      *(int *)(_out + (long)(iVar18 + iVar16) * 4) = (int)lVar55;
                    }
                    else {
                      *(int *)(_out + lVar55 * 4) = (int)lVar55;
                    }
                    iVar16 = iVar16 + -1;
                  }
                  for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXTiles(iVar17),
                      lVar55 < iVar16; lVar55 = lVar55 + 1) {
                    tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar55] = (int)lVar55;
                  }
                  if ((local_1cc & 1) != 0) {
                    for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17),
                        puVar11 = _out, lVar55 < iVar16; lVar55 = lVar55 + 1) {
                      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
                      fVar57 = (float)Imath_3_2::Rand32::nextf();
                      lVar56 = (long)(int)((float)(iVar16 + -1) * fVar57 +
                                           (1.0 - fVar57) * (float)(int)lVar55 + 0.5);
                      uVar43 = *(undefined4 *)(puVar11 + lVar55 * 4);
                      *(undefined4 *)(puVar11 + lVar55 * 4) = *(undefined4 *)(_out + lVar56 * 4);
                      *(undefined4 *)(_out + lVar56 * 4) = uVar43;
                    }
                    for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXTiles(iVar17),
                        piVar10 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start, lVar55 < iVar16;
                        lVar55 = lVar55 + 1) {
                      iVar16 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
                      fVar57 = (float)Imath_3_2::Rand32::nextf();
                      iVar18 = (int)((float)(iVar16 + -1) * fVar57 +
                                     (1.0 - fVar57) * (float)(int)lVar55 + 0.5);
                      iVar16 = piVar10[lVar55];
                      piVar10[lVar55] =
                           tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar18];
                      tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar18] = iVar16;
                    }
                  }
                  for (lVar55 = 0; iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17),
                      lVar55 < iVar16; lVar55 = lVar55 + 1) {
                    for (lVar56 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXTiles(iVar17),
                        lVar56 < iVar16; lVar56 = lVar56 + 1) {
                      Imf_3_4::TiledOutputFile::writeTile
                                (iVar17,tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_start[lVar56],
                                 *(int *)(_out + lVar55 * 4));
                    }
                  }
                  if (tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)tileXs.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)tileXs.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (_out != (undefined1 *)0x0) {
                    operator_delete(_out,local_138 - (long)_out);
                  }
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)&fb);
                  uVar38 = uVar38 + 1;
                } while (uVar38 != uVar50);
              }
              if (ph1._sizeX != 0) {
                operator_delete((void *)ph1._sizeX,(long)ph1._data - ph1._sizeX);
              }
              Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&tileYs);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8)
              ;
              std::ostream::flush();
              iVar16 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&tileYs,_Var13._M_p,iVar16);
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::dataWindow();
              iVar16 = *piVar30;
              iVar17 = piVar30[1];
              uVar38 = (long)iVar16;
              uVar19 = Imf_3_4::TiledInputFile::numLevels();
              local_108 = (ulong)uVar19;
              Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::Array
                        ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1,(long)(int)uVar19);
              uVar49 = 0;
              while( true ) {
                uVar43 = (undefined4)uVar38;
                iVar18 = Imf_3_4::TiledInputFile::numLevels();
                if ((long)iVar18 <= (long)uVar49) break;
                iVar18 = Imf_3_4::TiledInputFile::levelWidth((int)&tileYs);
                iVar71 = Imf_3_4::TiledInputFile::levelHeight((int)&tileYs);
                lVar55 = ph1._sizeY;
                lVar53 = (long)iVar18;
                lVar56 = iVar71 * lVar53;
                uVar38 = lVar56 * 2;
                if (lVar56 < 0) {
                  uVar38 = 0xffffffffffffffff;
                }
                pvVar31 = operator_new__(uVar38);
                plVar25 = (long *)(lVar55 + uVar49 * 0x18);
                if ((void *)plVar25[2] != (void *)0x0) {
                  operator_delete__((void *)plVar25[2]);
                  lVar55 = ph1._sizeY;
                }
                *plVar25 = (long)iVar71;
                plVar25[1] = lVar53;
                plVar25[2] = (long)pvVar31;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
                ;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                uVar38 = 2;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                Imf_3_4::Slice::Slice
                          ((Slice *)&out,HALF,
                           (char *)(*(long *)(lVar55 + 8 + uVar49 * 0x18) * -(long)iVar17 * 2 +
                                    *(long *)(lVar55 + 0x10 + uVar49 * 0x18) + (long)iVar16 * -2),2,
                           lVar53 * 2,1,1,0.0,false,false);
                Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
                Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                if (local_1d4 == uVar20) {
                  iVar18 = Imf_3_4::TiledInputFile::numYTiles((int)&tileYs);
                  iVar18 = iVar18 + -1;
                  iVar71 = -1;
                  iVar23 = -1;
                }
                else {
                  iVar71 = Imf_3_4::TiledInputFile::numYTiles((int)&tileYs);
                  iVar23 = 1;
                  iVar18 = 0;
                }
                for (; iVar18 != iVar71; iVar18 = iVar18 + iVar23) {
                  for (iVar47 = 0; iVar21 = Imf_3_4::TiledInputFile::numXTiles((int)&tileYs),
                      iVar47 < iVar21; iVar47 = iVar47 + 1) {
                    uVar38 = uVar49 & 0xffffffff;
                    Imf_3_4::TiledInputFile::readTile((int)&tileYs,iVar47,iVar18);
                  }
                }
                std::
                _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                             *)&fb);
                uVar49 = uVar49 + 1;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," comparing",10);
              std::ostream::flush();
              Imf_3_4::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_4::Header::displayWindow();
              puVar33 = (undefined8 *)Imf_3_4::Header::displayWindow();
              iVar16 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar17 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar62._4_4_ = iVar16;
              auVar62._0_4_ = iVar16;
              auVar62._8_4_ = iVar17;
              auVar62._12_4_ = iVar17;
              iVar16 = movmskpd(uVar43,auVar62);
              if ((iVar16 != 3) ||
                 (iVar17 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar18 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar63._4_4_ = iVar17,
                 auVar63._0_4_ = iVar17, auVar63._8_4_ = iVar18, auVar63._12_4_ = iVar18,
                 iVar17 = movmskpd((int)puVar33,auVar63), iVar17 != 3)) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17b,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_4::Header::dataWindow();
              puVar33 = (undefined8 *)Imf_3_4::Header::dataWindow();
              iVar17 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar18 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar64._4_4_ = iVar17;
              auVar64._0_4_ = iVar17;
              auVar64._8_4_ = iVar18;
              auVar64._12_4_ = iVar18;
              iVar16 = movmskpd(iVar16,auVar64);
              if ((iVar16 != 3) ||
                 (iVar16 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar17 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar65._4_4_ = iVar16,
                 auVar65._0_4_ = iVar16, auVar65._8_4_ = iVar17, auVar65._12_4_ = iVar17,
                 iVar16 = movmskpd((int)puVar33,auVar65), iVar16 != 3)) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17c,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
              fVar57 = *pfVar34;
              pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
              if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17d,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::screenWindowCenter();
              pfVar35 = (float *)Imf_3_4::Header::screenWindowCenter();
              if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
                  (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17f,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
              fVar57 = *pfVar34;
              pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
              if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x180,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::lineOrder();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_4::Header::lineOrder();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x181,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::compression();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_4::Header::compression();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x182,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pCVar36 = (ChannelList *)Imf_3_4::Header::channels();
              pCVar37 = (ChannelList *)Imf_3_4::Header::channels();
              cVar15 = Imf_3_4::ChannelList::operator==(pCVar36,pCVar37);
              if (cVar15 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x183,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              if (0 < (int)uVar19) {
                uVar38 = 0;
                do {
                  lVar56 = 0;
                  for (lVar55 = 0; iVar16 = Imf_3_4::TiledInputFile::levelHeight((int)&tileYs),
                      lVar55 < iVar16; lVar55 = lVar55 + 1) {
                    lVar53 = 0;
                    while (iVar16 = Imf_3_4::TiledInputFile::levelWidth((int)&tileYs),
                          lVar53 < iVar16) {
                      fVar57 = *(float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)
                                                 (*(long *)(ph1._sizeY + 8 + uVar38 * 0x18) * lVar56
                                                  + *(long *)(ph1._sizeY + 0x10 + uVar38 * 0x18) +
                                                 lVar53 * 2) * 4);
                      phVar29 = pAStack_f0[uVar38]._data + lVar53;
                      lVar53 = lVar53 + 1;
                      pfVar34 = (float *)(_imath_half_to_float_table +
                                         (ulong)*(uint16_t *)
                                                 ((long)&phVar29->_h +
                                                 pAStack_f0[uVar38]._sizeY * lVar56) * 4);
                      if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                        __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                      ,0x188,
                                      "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                     );
                      }
                    }
                    lVar56 = lVar56 + 2;
                  }
                  uVar38 = uVar38 + 1;
                } while (uVar38 != local_108);
              }
              Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1);
              if (local_1f0 != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0);
              }
              if (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
              }
              remove(_Var13._M_p);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
              std::ostream::put(-0x60);
              std::ostream::flush();
              Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&rand1);
              Imf_3_4::Header::~Header(&hdr);
              _Var13 = filename._M_dataplus;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"LineOrder ",10);
              poVar24 = (ostream *)std::ostream::operator<<(&std::cout,local_1d4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", buffer ",9);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", seek ",7);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", levelMode 2, ",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,"roundingMode ",0xd);
              poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", compression ",0xe);
              plVar25 = (long *)std::ostream::operator<<(poVar24,uVar42);
              std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
              std::ostream::put((char)plVar25);
              std::ostream::flush();
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              Imf_3_4::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&tileYs,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar26 = (uint *)Imf_3_4::Header::compression();
              *puVar26 = uVar42;
              puVar27 = (undefined4 *)Imf_3_4::Header::lineOrder();
              *puVar27 = 0;
              pcVar28 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar28,(Channel *)0x1c529f);
              _out = &DAT_3700000037;
              Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8)
              ;
              std::ostream::flush();
              remove(_Var13._M_p);
              iVar16 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&tileYs,_Var13._M_p,&hdr,iVar16);
              iVar16 = Imf_3_4::TiledOutputFile::numYLevels();
              iVar17 = Imf_3_4::TiledOutputFile::numXLevels();
              lVar55 = (long)iVar17;
              uVar50 = iVar16 * lVar55;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar50;
              uVar38 = SUB168(auVar3 * ZEXT816(0x18),0);
              uVar49 = uVar38 + 8;
              if (0xfffffffffffffff7 < uVar38) {
                uVar49 = 0xffffffffffffffff;
              }
              if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
                uVar49 = 0xffffffffffffffff;
              }
              puVar39 = (ulong *)operator_new__(uVar49);
              *puVar39 = uVar50;
              __s = puVar39 + 1;
              if (uVar50 != 0) {
                memset(__s,0,((uVar38 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              rand1_1._state = 0x5a5a5a5a;
              iVar16 = Imf_3_4::TiledOutputFile::numXLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&ph1,(long)iVar16,
                         (allocator_type *)&out);
              iVar16 = Imf_3_4::TiledOutputFile::numYLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar16,(allocator_type *)&out);
              for (lVar56 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXLevels(), lVar56 < iVar16;
                  lVar56 = lVar56 + 1) {
                *(int *)(ph1._sizeX + lVar56 * 4) = (int)lVar56;
              }
              for (lVar56 = 0; iVar16 = Imf_3_4::TiledOutputFile::numYLevels(), lVar56 < iVar16;
                  lVar56 = lVar56 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar56] = (int)lVar56;
              }
              if ((local_1cc & 1) != 0) {
                for (lVar56 = 0; iVar16 = Imf_3_4::TiledOutputFile::numXLevels(),
                    lVar53 = ph1._sizeX, lVar56 < iVar16; lVar56 = lVar56 + 1) {
                  iVar16 = Imf_3_4::TiledOutputFile::numXLevels();
                  fVar57 = (float)Imath_3_2::Rand32::nextf();
                  lVar40 = (long)(int)((float)(iVar16 + -1) * fVar57 +
                                       (1.0 - fVar57) * (float)(int)lVar56 + 0.5);
                  uVar43 = *(undefined4 *)(lVar53 + lVar56 * 4);
                  *(undefined4 *)(lVar53 + lVar56 * 4) = *(undefined4 *)(ph1._sizeX + lVar40 * 4);
                  *(undefined4 *)(ph1._sizeX + lVar40 * 4) = uVar43;
                }
                for (lVar56 = 0; iVar16 = Imf_3_4::TiledOutputFile::numYLevels(),
                    piVar10 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar56 < iVar16; lVar56 = lVar56 + 1
                    ) {
                  iVar16 = Imf_3_4::TiledOutputFile::numYLevels();
                  fVar57 = (float)Imath_3_2::Rand32::nextf();
                  iVar17 = (int)((float)(iVar16 + -1) * fVar57 + (1.0 - fVar57) * (float)(int)lVar56
                                + 0.5);
                  iVar16 = piVar10[lVar56];
                  piVar10[lVar56] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = iVar16;
                }
              }
              lVar56 = 0;
              while( true ) {
                iVar16 = Imf_3_4::TiledOutputFile::numYLevels();
                if (iVar16 <= lVar56) break;
                iVar16 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar56];
                iVar17 = Imf_3_4::TiledOutputFile::numYTiles((int)(TiledOutputFile *)&tileYs);
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&rand1,(long)iVar17,
                           (allocator_type *)&out);
                iVar17 = -1;
                for (lVar53 = 0; iVar18 = Imf_3_4::TiledOutputFile::numYTiles((int)&tileYs),
                    lVar53 < iVar18; lVar53 = lVar53 + 1) {
                  if (bVar5) {
                    iVar18 = Imf_3_4::TiledOutputFile::numYTiles((int)&tileYs);
                    *(int *)(rand1._state + (long)(iVar18 + iVar17) * 4) = (int)lVar53;
                  }
                  else {
                    *(int *)(rand1._state + lVar53 * 4) = (int)lVar53;
                  }
                  iVar17 = iVar17 + -1;
                }
                if ((local_1cc & 1) != 0) {
                  for (lVar53 = 0; iVar17 = Imf_3_4::TiledOutputFile::numYTiles((int)&tileYs),
                      lVar53 < iVar17; lVar53 = lVar53 + 1) {
                    RVar12._state = rand1._state;
                    iVar17 = Imf_3_4::TiledOutputFile::numYTiles((int)&tileYs);
                    fVar57 = (float)Imath_3_2::Rand32::nextf();
                    lVar40 = (long)(int)((float)(iVar17 + -1) * fVar57 +
                                         (1.0 - fVar57) * (float)(int)lVar53 + 0.5);
                    uVar43 = *(undefined4 *)(RVar12._state + lVar53 * 4);
                    *(undefined4 *)(RVar12._state + lVar53 * 4) =
                         *(undefined4 *)(rand1._state + lVar40 * 4);
                    *(undefined4 *)(rand1._state + lVar40 * 4) = uVar43;
                  }
                }
                lVar53 = 0;
                while( true ) {
                  iVar17 = Imf_3_4::TiledOutputFile::numXLevels();
                  if (iVar17 <= lVar53) break;
                  iVar17 = *(int *)(ph1._sizeX + lVar53 * 4);
                  iVar18 = Imf_3_4::TiledOutputFile::levelWidth((int)&tileYs);
                  iVar71 = Imf_3_4::TiledOutputFile::levelHeight((int)&tileYs);
                  lVar54 = (long)iVar18;
                  lVar40 = iVar71 * lVar54;
                  uVar38 = lVar40 * 2;
                  if (lVar40 < 0) {
                    uVar38 = 0xffffffffffffffff;
                  }
                  phVar29 = (half *)operator_new__(uVar38);
                  pAVar51 = (Array2D<Imath_3_2::half> *)
                            (__s + iVar16 * lVar55 * 3 + (long)iVar17 * 3);
                  if (pAVar51->_data != (half *)0x0) {
                    operator_delete__(pAVar51->_data);
                  }
                  pAVar51->_sizeX = (long)iVar71;
                  pAVar51->_sizeY = lVar54;
                  pAVar51->_data = phVar29;
                  fillPixels(pAVar51,iVar18,iVar71);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_4::Slice::Slice
                            ((Slice *)&out,HALF,(char *)pAVar51->_data,2,lVar54 * 2,1,1,0.0,false,
                             false);
                  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
                  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                  iVar18 = Imf_3_4::TiledOutputFile::numXTiles((int)(FrameBuffer *)&tileYs);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&out,(long)iVar18,&local_1cd);
                  for (lVar40 = 0; iVar18 = Imf_3_4::TiledOutputFile::numXTiles((int)&tileYs),
                      lVar40 < iVar18; lVar40 = lVar40 + 1) {
                    *(int *)(_out + lVar40 * 4) = (int)lVar40;
                  }
                  if ((local_1cc & 1) != 0) {
                    for (lVar40 = 0; iVar18 = Imf_3_4::TiledOutputFile::numXTiles((int)&tileYs),
                        puVar11 = _out, lVar40 < iVar18; lVar40 = lVar40 + 1) {
                      iVar18 = Imf_3_4::TiledOutputFile::numXTiles((int)&tileYs);
                      fVar57 = (float)Imath_3_2::Rand32::nextf();
                      lVar54 = (long)(int)((float)(iVar18 + -1) * fVar57 +
                                           (1.0 - fVar57) * (float)(int)lVar40 + 0.5);
                      uVar43 = *(undefined4 *)(puVar11 + lVar40 * 4);
                      *(undefined4 *)(puVar11 + lVar40 * 4) = *(undefined4 *)(_out + lVar54 * 4);
                      *(undefined4 *)(_out + lVar54 * 4) = uVar43;
                    }
                  }
                  for (lVar40 = 0; iVar18 = Imf_3_4::TiledOutputFile::numYTiles((int)&tileYs),
                      lVar40 < iVar18; lVar40 = lVar40 + 1) {
                    for (lVar54 = 0; iVar18 = Imf_3_4::TiledOutputFile::numXTiles((int)&tileYs),
                        lVar54 < iVar18; lVar54 = lVar54 + 1) {
                      Imf_3_4::TiledOutputFile::writeTile
                                ((int)&tileYs,*(int *)(_out + lVar54 * 4),
                                 *(int *)(rand1._state + lVar40 * 4),iVar17);
                    }
                  }
                  if (_out != (undefined1 *)0x0) {
                    operator_delete(_out,local_138 - (long)_out);
                  }
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)&fb);
                  lVar53 = lVar53 + 1;
                }
                if (rand1._state != 0) {
                  operator_delete((void *)rand1._state,(long)local_e8 - rand1._state);
                }
                lVar56 = lVar56 + 1;
              }
              if (tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (ph1._sizeX != 0) {
                operator_delete((void *)ph1._sizeX,(long)ph1._data - ph1._sizeX);
              }
              Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&tileYs);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8)
              ;
              std::ostream::flush();
              iVar16 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&tileYs,_Var13._M_p,iVar16);
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::dataWindow();
              iVar16 = *piVar30;
              iVar17 = piVar30[1];
              uVar19 = Imf_3_4::TiledInputFile::numXLevels();
              uVar22 = Imf_3_4::TiledInputFile::numYLevels();
              lVar56 = (long)(int)uVar19;
              uVar50 = (int)uVar22 * lVar56;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar50;
              uVar38 = SUB168(auVar4 * ZEXT816(0x18),0);
              uVar49 = uVar38 + 8;
              puVar45 = (ulong *)0xffffffffffffffff;
              if (0xfffffffffffffff7 < uVar38) {
                uVar49 = 0xffffffffffffffff;
              }
              if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
                uVar49 = 0xffffffffffffffff;
              }
              puVar41 = (ulong *)operator_new__(uVar49);
              *puVar41 = uVar50;
              __s_00 = puVar41 + 1;
              if (uVar50 != 0) {
                puVar45 = (ulong *)0xaaaaaaaaaaaaaaab;
                memset(__s_00,0,((uVar38 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              lVar53 = 0;
              while( true ) {
                uVar43 = SUB84(puVar45,0);
                iVar18 = Imf_3_4::TiledInputFile::numYLevels();
                if (iVar18 <= lVar53) break;
                if (local_1d4 == uVar20) {
                  iVar71 = Imf_3_4::TiledInputFile::numYTiles((int)&tileYs);
                  iVar71 = iVar71 + -1;
                  iVar18 = -1;
                  local_1e8._0_4_ = -1;
                }
                else {
                  iVar18 = Imf_3_4::TiledInputFile::numYTiles((int)&tileYs);
                  local_1e8._0_4_ = 1;
                  iVar71 = 0;
                }
                puVar45 = __s_00;
                for (uVar38 = 0; iVar23 = Imf_3_4::TiledInputFile::numXLevels(),
                    (long)uVar38 < (long)iVar23; uVar38 = uVar38 + 1) {
                  iVar23 = Imf_3_4::TiledInputFile::levelWidth((int)&tileYs);
                  iVar47 = Imf_3_4::TiledInputFile::levelHeight((int)&tileYs);
                  uVar50 = (ulong)iVar23;
                  lVar40 = (long)iVar47 * uVar50;
                  uVar49 = lVar40 * 2;
                  if (lVar40 < 0) {
                    uVar49 = 0xffffffffffffffff;
                  }
                  pvVar31 = operator_new__(uVar49);
                  puVar45 = __s_00 + lVar53 * lVar56 * 3 + uVar38 * 3;
                  if ((void *)puVar45[2] != (void *)0x0) {
                    operator_delete__((void *)puVar45[2]);
                  }
                  *puVar45 = (long)iVar47;
                  puVar45[1] = uVar50;
                  puVar45[2] = (ulong)pvVar31;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  puVar45 = (ulong *)0x2;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_4::Slice::Slice
                            ((Slice *)&out,HALF,
                             (char *)((long)pvVar31 + (long)iVar16 * -2 + uVar50 * -(long)iVar17 * 2
                                     ),2,uVar50 * 2,1,1,0.0,false,false);
                  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
                  Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                  for (iVar23 = iVar71; iVar23 != iVar18; iVar23 = iVar23 + (int)local_1e8) {
                    for (iVar47 = 0; iVar21 = Imf_3_4::TiledInputFile::numXTiles((int)&tileYs),
                        iVar47 < iVar21; iVar47 = iVar47 + 1) {
                      puVar45 = (ulong *)(uVar38 & 0xffffffff);
                      Imf_3_4::TiledInputFile::readTile((int)&tileYs,iVar47,iVar23,(int)uVar38);
                    }
                  }
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)&fb);
                }
                lVar53 = lVar53 + 1;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," comparing",10);
              std::ostream::flush();
              Imf_3_4::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_4::Header::displayWindow();
              puVar33 = (undefined8 *)Imf_3_4::Header::displayWindow();
              iVar16 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar17 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar66._4_4_ = iVar16;
              auVar66._0_4_ = iVar16;
              auVar66._8_4_ = iVar17;
              auVar66._12_4_ = iVar17;
              iVar16 = movmskpd(uVar43,auVar66);
              if ((iVar16 != 3) ||
                 (iVar17 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar18 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar67._4_4_ = iVar17,
                 auVar67._0_4_ = iVar17, auVar67._8_4_ = iVar18, auVar67._12_4_ = iVar18,
                 iVar17 = movmskpd((int)puVar33,auVar67), iVar17 != 3)) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,600,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_4::Header::dataWindow();
              puVar33 = (undefined8 *)Imf_3_4::Header::dataWindow();
              iVar17 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar18 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar68._4_4_ = iVar17;
              auVar68._0_4_ = iVar17;
              auVar68._8_4_ = iVar18;
              auVar68._12_4_ = iVar18;
              iVar16 = movmskpd(iVar16,auVar68);
              if ((iVar16 != 3) ||
                 (iVar16 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar17 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar69._4_4_ = iVar16,
                 auVar69._0_4_ = iVar16, auVar69._8_4_ = iVar17, auVar69._12_4_ = iVar17,
                 iVar16 = movmskpd((int)puVar33,auVar69), iVar16 != 3)) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x259,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
              fVar57 = *pfVar34;
              pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
              if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25a,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::screenWindowCenter();
              pfVar35 = (float *)Imf_3_4::Header::screenWindowCenter();
              if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
                  (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25c,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
              fVar57 = *pfVar34;
              pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
              if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25d,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::lineOrder();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_4::Header::lineOrder();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25e,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar30 = (int *)Imf_3_4::Header::compression();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_4::Header::compression();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25f,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pCVar36 = (ChannelList *)Imf_3_4::Header::channels();
              pCVar37 = (ChannelList *)Imf_3_4::Header::channels();
              cVar15 = Imf_3_4::ChannelList::operator==(pCVar36,pCVar37);
              if (cVar15 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x260,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              if (0 < (int)uVar22) {
                local_1e8 = (_Base_ptr)0x0;
                do {
                  if (0 < (int)uVar19) {
                    uVar38 = 0;
                    do {
                      lVar53 = 0;
                      for (local_210 = 0;
                          iVar16 = Imf_3_4::TiledInputFile::levelHeight((int)&tileYs),
                          local_210 < iVar16; local_210 = local_210 + 1) {
                        lVar40 = 0;
                        while (iVar16 = Imf_3_4::TiledInputFile::levelWidth((int)&tileYs),
                              lVar40 < iVar16) {
                          fVar57 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)
                                                     (__s_00[(long)local_1e8 * lVar56 * 3 +
                                                             uVar38 * 3 + 1] * lVar53 +
                                                      __s_00[(long)local_1e8 * lVar56 * 3 +
                                                             uVar38 * 3 + 2] + lVar40 * 2) * 4);
                          lVar54 = lVar40 * 2;
                          lVar40 = lVar40 + 1;
                          pfVar34 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)
                                                     (__s[(long)local_1e8 * lVar55 * 3 +
                                                          uVar38 * 3 + 1] * lVar53 +
                                                      __s[(long)local_1e8 * lVar55 * 3 +
                                                          uVar38 * 3 + 2] + lVar54) * 4);
                          if ((fVar57 != *pfVar34) || (NAN(fVar57) || NAN(*pfVar34))) {
                            __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                          ,0x267,
                                          "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                         );
                          }
                        }
                        lVar53 = lVar53 + 2;
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar19);
                  }
                  local_1e8 = (_Base_ptr)((long)&local_1e8->_M_color + 1);
                } while (local_1e8 != (_Base_ptr)(ulong)uVar22);
              }
              if (__s_00 != (ulong *)0x0) {
                if (*puVar41 == 0) {
                  uVar38 = 8;
                }
                else {
                  lVar55 = *puVar41 * 0x18;
                  lVar56 = lVar55;
                  do {
                    if (*(void **)((long)puVar41 + lVar56) != (void *)0x0) {
                      operator_delete__(*(void **)((long)puVar41 + lVar56));
                    }
                    lVar56 = lVar56 + -0x18;
                  } while (lVar56 != 0);
                  uVar38 = lVar55 + 8;
                }
                operator_delete__(puVar41,uVar38);
              }
              if (local_1f0 != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0);
              }
              if (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
              }
              remove(_Var13._M_p);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
              std::ostream::put(-0x60);
              std::ostream::flush();
              if (__s != (ulong *)0x0) {
                if (*puVar39 == 0) {
                  uVar38 = 8;
                }
                else {
                  lVar55 = *puVar39 * 0x18;
                  lVar56 = lVar55;
                  do {
                    if (*(void **)((long)puVar39 + lVar56) != (void *)0x0) {
                      operator_delete__(*(void **)((long)puVar39 + lVar56));
                    }
                    lVar56 = lVar56 + -0x18;
                  } while (lVar56 != 0);
                  uVar38 = lVar55 + 8;
                }
                operator_delete__(puVar39,uVar38);
              }
              Imf_3_4::Header::~Header(&hdr);
              bVar52 = 1;
              bVar14 = false;
            } while (bVar6);
            uVar19 = 1;
            bVar14 = false;
          } while (bVar7);
          local_1d8 = 1;
          bVar14 = false;
        } while (bVar8);
        local_1d4 = 1;
        bVar5 = true;
        bVar14 = false;
      } while (bVar9);
    }
    uVar42 = uVar42 + 1;
    if (uVar42 == 10) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeCopyRead (const std::string& tempDir, int w, int h, int xs, int ys)
{
    std::string filename = tempDir + "imf_test_copy.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION) { continue; }

        for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
        {
            for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
            {
                for (int tb = 0; tb <= 1; ++tb)
                {
                    for (int ts = 0; ts <= 1; ++ts)
                    {
                        writeCopyReadONE (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadMIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadRIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);
                    }
                }
            }
        }
    }
}